

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getBasis(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VarStatus *rows,VarStatus *cols,int rowsSize,int colsSize)

{
  VarStatus *pVVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(this->m_rBasisStat).thesize;
  if (0 < lVar2) {
    pVVar1 = (this->m_rBasisStat).data;
    lVar3 = 0;
    do {
      rows[lVar3] = pVVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  lVar2 = (long)(this->m_cBasisStat).thesize;
  if (0 < lVar2) {
    pVVar1 = (this->m_cBasisStat).data;
    lVar3 = 0;
    do {
      cols[lVar3] = pVVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

virtual void getBasis(typename SPxSolverBase<R>::VarStatus rows[],
                         typename SPxSolverBase<R>::VarStatus cols[], const int rowsSize = -1, const int colsSize = -1) const
   {
      assert(m_postsolved);
      assert(rowsSize < 0 || rowsSize >= m_rBasisStat.size());
      assert(colsSize < 0 || colsSize >= m_cBasisStat.size());

      for(int i = 0; i < m_rBasisStat.size(); ++i)
         rows[i] = m_rBasisStat[i];

      for(int j = 0; j < m_cBasisStat.size(); ++j)
         cols[j] = m_cBasisStat[j];
   }